

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JSON.cpp
# Opt level: O0

double JSON::ParseInt(wchar_t **data)

{
  wchar_t *pwVar1;
  bool bVar2;
  double integer;
  wchar_t **data_local;
  
  integer = 0.0;
  while( true ) {
    bVar2 = false;
    if ((**data != L'\0') && (bVar2 = false, L'/' < **data)) {
      bVar2 = **data < L':';
    }
    if (!bVar2) break;
    pwVar1 = *data;
    *data = pwVar1 + 1;
    integer = integer * 10.0 + (double)(*pwVar1 + L'\xffffffd0');
  }
  return integer;
}

Assistant:

double JSON::ParseInt(const wchar_t **data)
{
	double integer = 0;
	while (**data != 0 && **data >= '0' && **data <= '9')
		integer = integer * 10 + (*(*data)++ - '0');
	
	return integer;
}